

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

int raptor_asprintf(char **strp,char *format,...)

{
  long lVar1;
  size_t size;
  char *pcVar2;
  size_t strp_buflen;
  char local_b8 [4];
  int ret;
  char buf [128];
  va_list args;
  char *format_local;
  char **strp_local;
  
  buf[0x7c] = '0';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  buf[0x78] = '\x10';
  buf[0x79] = '\0';
  buf[0x7a] = '\0';
  buf[0x7b] = '\0';
  memset(local_b8,0,0x80);
  strp_local._4_4_ = vsnprintf(local_b8,0x80,format,buf + 0x78);
  if (strp_local._4_4_ < 0) {
    *strp = (char *)0x0;
    strp_local._4_4_ = -1;
  }
  else {
    lVar1 = (long)strp_local._4_4_;
    size = lVar1 + 1;
    pcVar2 = (char *)raptor::Malloc(size);
    *strp = pcVar2;
    if (pcVar2 == (char *)0x0) {
      strp_local._4_4_ = -1;
    }
    else {
      buf[0x7c] = '0';
      buf[0x7d] = '\0';
      buf[0x7e] = '\0';
      buf[0x7f] = '\0';
      buf[0x78] = '\x10';
      buf[0x79] = '\0';
      buf[0x7a] = '\0';
      buf[0x7b] = '\0';
      if (size < 0x81) {
        memcpy(*strp,local_b8,size);
      }
      else {
        strp_local._4_4_ = vsnprintf(*strp,size,format,buf + 0x78);
        if (strp_local._4_4_ != lVar1) {
          raptor::Free(*strp);
          *strp = (char *)0x0;
          strp_local._4_4_ = -1;
        }
      }
    }
  }
  return strp_local._4_4_;
}

Assistant:

int raptor_asprintf(char** strp, const char* format, ...) {
    va_list args;
    va_start(args, format);
#ifdef _WIN32
    int ret = _vscprintf(format, args);
#else
    char buf[128] = { 0 };
    int ret = vsnprintf(buf, sizeof(buf), format, args);
#endif
    va_end(args);
    if (ret < 0) {
        *strp = nullptr;
        return -1;
    }

    size_t strp_buflen = static_cast<size_t>(ret) + 1;
    if ((*strp = static_cast<char*>(raptor::Malloc(strp_buflen))) == nullptr) {
        return -1;
    }

    // try again using the larger buffer.
    va_start(args, format);
#ifdef _WIN32
    ret = vsnprintf_s(*strp, strp_buflen, _TRUNCATE, format, args);
#else
    if (strp_buflen <= sizeof(buf)) {
        memcpy(*strp, buf, strp_buflen);
        return ret;
    }
    ret = vsnprintf(*strp, strp_buflen, format, args);
#endif
    va_end(args);
    if (static_cast<size_t>(ret) == strp_buflen - 1) {
        return ret;
    }

    // this should never happen.
    raptor::Free(*strp);
    *strp = nullptr;
    return -1;
}